

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.h
# Opt level: O0

bool __thiscall
RingBuffer<1000,_ImpactGenerator::Impact>::Read
          (RingBuffer<1000,_ImpactGenerator::Impact> *this,Impact *val)

{
  float fVar1;
  Impact *pIVar2;
  int local_34;
  int r;
  Impact *val_local;
  RingBuffer<1000,_ImpactGenerator::Impact> *this_local;
  
  local_34 = this->readpos;
  if (local_34 == this->writepos) {
    this_local._7_1_ = false;
  }
  else {
    if (local_34 == 999) {
      local_34 = 0;
    }
    else {
      local_34 = local_34 + 1;
    }
    pIVar2 = this->buffer + local_34;
    fVar1 = pIVar2->decay;
    val->volume = pIVar2->volume;
    val->decay = fVar1;
    fVar1 = pIVar2->bpf;
    val->lpf = pIVar2->lpf;
    val->bpf = fVar1;
    fVar1 = pIVar2->bw;
    val->cut = pIVar2->cut;
    val->bw = fVar1;
    this->readpos = local_34;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

inline bool Read(T& val)
    {
        int r = readpos;
        if (r == writepos)
            return false;
        r = (r == LENGTH - 1) ? 0 : (r + 1);
        val = buffer[r];
        readpos = r;
        return true;
    }